

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O3

ngx_int_t ngx_parse_url(ngx_pool_t *pool,ngx_url_t *u)

{
  uchar *addr;
  uint uVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  ushort uVar7;
  in_addr_t iVar8;
  ngx_int_t nVar9;
  char *pcVar10;
  ulong uVar11;
  u_char *puVar12;
  ngx_addr_t *pnVar13;
  sockaddr *psVar14;
  u_char *puVar15;
  u_char *puVar16;
  u_char *puVar17;
  u_char *puVar18;
  ulong uVar19;
  uint uVar20;
  in6_addr *__a;
  size_t sVar21;
  u_char *puVar22;
  size_t sVar23;
  
  uVar19 = (u->url).len;
  puVar15 = (u->url).data;
  if (uVar19 < 5) {
    puVar18 = puVar15;
    if (uVar19 != 0) goto LAB_001198ca;
    u->socklen = 0x10;
    (u->sockaddr).sockaddr.sa_family = 2;
    u->family = 2;
    uVar19 = 0;
    puVar12 = puVar15;
LAB_00119964:
    puVar16 = (u_char *)0x0;
    puVar22 = (u_char *)0x0;
    puVar17 = (u_char *)0x0;
    puVar18 = puVar15;
  }
  else {
    nVar9 = ngx_strncasecmp(puVar15,(u_char *)"unix:",5);
    uVar19 = (u->url).len;
    puVar18 = (u->url).data;
    if (nVar9 == 0) {
      puVar15 = puVar18 + 5;
      sVar23 = uVar19 - 5;
      if (((u->field_0x48 & 2) != 0) && (puVar15 < puVar18 + uVar19)) {
        puVar18 = puVar18 + 6;
        sVar21 = 0;
        do {
          if (puVar18[-1] == ':') {
            (u->uri).len = (uVar19 - sVar21) - 6;
            (u->uri).data = puVar18;
            sVar23 = sVar21;
            break;
          }
          puVar18 = puVar18 + 1;
          sVar21 = sVar21 + 1;
        } while (uVar19 - 5 != sVar21);
      }
      if (sVar23 == 0) {
        pcVar10 = "no path in the unix domain socket";
      }
      else {
        uVar19 = sVar23 + 1;
        (u->host).len = sVar23;
        (u->host).data = puVar15;
        if (uVar19 < 0x6d) {
          u->socklen = 0x6e;
          (u->sockaddr).sockaddr.sa_family = 1;
          ngx_cpystrn((u_char *)&(u->sockaddr).sockaddr_in.sin_port,puVar15,uVar19);
          pnVar13 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
          u->addrs = pnVar13;
          if (pnVar13 == (ngx_addr_t *)0x0) {
            return -1;
          }
          psVar14 = (sockaddr *)ngx_pcalloc(pool,0x6e);
          if (psVar14 != (sockaddr *)0x0) {
            u->family = 1;
            u->naddrs = 1;
            psVar14->sa_family = 1;
            ngx_cpystrn((u_char *)psVar14->sa_data,puVar15,uVar19);
            pnVar13 = u->addrs;
            pnVar13->sockaddr = psVar14;
            pnVar13->socklen = 0x6e;
            (pnVar13->name).len = sVar23 + 5;
            (pnVar13->name).data = (u->url).data;
            return 0;
          }
          return -1;
        }
        pcVar10 = "too long path in the unix domain socket";
      }
      goto LAB_00119c84;
    }
LAB_001198ca:
    if (*puVar15 == '[') {
      u->socklen = 0x1c;
      (u->sockaddr).sockaddr.sa_family = 10;
      if (1 < (long)uVar19) {
        puVar15 = puVar18 + uVar19;
        sVar23 = 0;
        do {
          if (puVar18[sVar23 + 1] == ']') {
            puVar12 = puVar18 + sVar23 + 2;
            if (puVar15 <= puVar12) goto LAB_00119a81;
            sVar21 = (uVar19 - sVar23) - 2;
            puVar22 = puVar12;
            goto LAB_00119a6c;
          }
          sVar23 = sVar23 + 1;
        } while (uVar19 - 1 != sVar23);
      }
      goto LAB_00119c7d;
    }
    u->socklen = 0x10;
    (u->sockaddr).sockaddr.sa_family = 2;
    u->family = 2;
    puVar12 = puVar18 + uVar19;
    puVar15 = puVar18;
    if ((long)uVar19 < 1) goto LAB_00119964;
    puVar22 = (u_char *)0x0;
    uVar11 = 0;
    do {
      if (puVar18[uVar11] == ':') {
        puVar22 = puVar18 + uVar11;
        break;
      }
      uVar11 = uVar11 + 1;
    } while (uVar19 != uVar11);
    puVar16 = (u_char *)0x0;
    uVar11 = 0;
    do {
      if (puVar18[uVar11] == '/') {
        puVar16 = puVar18 + uVar11;
        break;
      }
      uVar11 = uVar11 + 1;
    } while (uVar19 != uVar11);
    puVar17 = (u_char *)0x0;
    uVar11 = 0;
    do {
      if (puVar18[uVar11] == '?') {
        puVar17 = puVar18 + uVar11;
        break;
      }
      uVar11 = uVar11 + 1;
    } while (uVar19 != uVar11);
  }
  puVar15 = puVar16;
  if (puVar17 < puVar16) {
    puVar15 = puVar17;
  }
  if (puVar16 == (u_char *)0x0) {
    puVar15 = puVar17;
  }
  if (puVar17 == (u_char *)0x0) {
    puVar15 = puVar16;
  }
  if (puVar15 == (u_char *)0x0) {
    if (puVar22 != (u_char *)0x0) goto LAB_00119a00;
    bVar6 = u->field_0x48;
    if ((bVar6 & 1) != 0) {
      nVar9 = ngx_atoi(puVar18,uVar19);
      if (nVar9 != -1) {
        if (0xffffffffffff0000 < nVar9 - 0x10000U) {
          uVar7 = (ushort)nVar9;
          u->port = uVar7;
          (u->sockaddr).sockaddr_in.sin_port = uVar7 << 8 | uVar7 >> 8;
          (u->port_text).len = uVar19;
          (u->port_text).data = puVar18;
          goto LAB_00119bfb;
        }
        goto LAB_00119a29;
      }
      bVar6 = u->field_0x48;
    }
LAB_00119cae:
    puVar22 = puVar12;
    u->field_0x48 = bVar6 | 8;
    uVar7 = u->default_port;
    u->port = uVar7;
    (u->sockaddr).sockaddr_in.sin_port = uVar7 << 8 | uVar7 >> 8;
  }
  else {
    bVar6 = u->field_0x48;
    if ((bVar6 & 3) != 2) {
LAB_00119c7d:
      pcVar10 = "invalid host";
      goto LAB_00119c84;
    }
    (u->uri).len = (long)puVar12 - (long)puVar15;
    (u->uri).data = puVar15;
    puVar12 = puVar15;
    if ((puVar22 == (u_char *)0x0) || (puVar15 < puVar22)) goto LAB_00119cae;
LAB_00119a00:
    puVar15 = puVar22 + 1;
    nVar9 = ngx_atoi(puVar15,(long)puVar12 - (long)puVar15);
    if (nVar9 - 0x10000U < 0xffffffffffff0001) goto LAB_00119a29;
    uVar7 = (ushort)nVar9;
    u->port = uVar7;
    (u->sockaddr).sockaddr_in.sin_port = uVar7 << 8 | uVar7 >> 8;
    (u->port_text).len = (long)puVar12 - (long)puVar15;
    (u->port_text).data = puVar15;
  }
  sVar23 = (long)puVar22 - (long)puVar18;
  if (sVar23 != 0) {
    (u->host).len = sVar23;
    (u->host).data = puVar18;
    bVar6 = u->field_0x48;
    if ((sVar23 == 1 && (bVar6 & 1) != 0) && (*puVar18 == '*')) {
      (u->sockaddr).sockaddr_in6.sin6_flowinfo = 0;
      u->field_0x48 = bVar6 | 0x10;
      return 0;
    }
    iVar8 = ngx_inet_addr(puVar18,sVar23);
    (u->sockaddr).sockaddr_in6.sin6_flowinfo = iVar8;
    if (iVar8 != 0xffffffff) {
      if (iVar8 == 0) {
        u->field_0x48 = bVar6 | 0x10;
      }
      u->naddrs = 1;
      pnVar13 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
      u->addrs = pnVar13;
      if (pnVar13 == (ngx_addr_t *)0x0) {
        return -1;
      }
      psVar14 = (sockaddr *)ngx_pcalloc(pool,0x10);
      if (psVar14 == (sockaddr *)0x0) {
        return -1;
      }
      uVar3 = *(undefined8 *)&u->sockaddr;
      uVar4 = *(undefined8 *)((long)&u->sockaddr + 8);
      psVar14->sa_family = (short)uVar3;
      psVar14->sa_data[0] = (char)((ulong)uVar3 >> 0x10);
      psVar14->sa_data[1] = (char)((ulong)uVar3 >> 0x18);
      psVar14->sa_data[2] = (char)((ulong)uVar3 >> 0x20);
      psVar14->sa_data[3] = (char)((ulong)uVar3 >> 0x28);
      psVar14->sa_data[4] = (char)((ulong)uVar3 >> 0x30);
      psVar14->sa_data[5] = (char)((ulong)uVar3 >> 0x38);
      *(undefined8 *)(psVar14->sa_data + 6) = uVar4;
      pnVar13 = u->addrs;
      pnVar13->sockaddr = psVar14;
      pnVar13->socklen = 0x10;
LAB_00119d8c:
      puVar15 = (u_char *)ngx_pnalloc(pool,(u->host).len + 6);
      if (puVar15 != (u_char *)0x0) {
        puVar18 = ngx_sprintf(puVar15,"%V:%d",&u->host,(ulong)u->port);
        pnVar13 = u->addrs;
        (pnVar13->name).len = (long)puVar18 - (long)puVar15;
        (pnVar13->name).data = puVar15;
        return 0;
      }
      return -1;
    }
    if ((bVar6 & 4) != 0) {
      return 0;
    }
    nVar9 = ngx_inet_resolve_host(pool,u);
    if (nVar9 != 0) {
      return -1;
    }
    psVar14 = u->addrs->sockaddr;
    uVar20 = (uint)psVar14->sa_family;
    u->family = uVar20;
    uVar1 = u->addrs->socklen;
    u->socklen = uVar1;
    memcpy(&u->sockaddr,psVar14,(ulong)uVar1);
    if (uVar20 == 10) {
      if (*(int *)((long)&u->sockaddr + 8) != 0) {
        return 0;
      }
      if (*(int *)((long)&u->sockaddr + 0xc) != 0) {
        return 0;
      }
      if (*(int *)((long)&u->sockaddr + 0x10) != 0) {
        return 0;
      }
      uVar2 = *(uint32_t *)((long)&u->sockaddr + 0x14);
    }
    else {
      uVar2 = (u->sockaddr).sockaddr_in6.sin6_flowinfo;
    }
    if (uVar2 != 0) {
      return 0;
    }
LAB_00119bfb:
    u->field_0x48 = u->field_0x48 | 0x10;
    return 0;
  }
  goto LAB_00119ddb;
  while( true ) {
    puVar22 = puVar22 + 1;
    sVar21 = sVar21 - 1;
    if (sVar21 == 0) break;
LAB_00119a6c:
    if (*puVar22 == '/') {
      if ((u->field_0x48 & 3) != 2) goto LAB_00119c7d;
      (u->uri).len = sVar21;
      (u->uri).data = puVar22;
      puVar15 = puVar22;
      break;
    }
  }
LAB_00119a81:
  if (puVar12 < puVar15) {
    if (*puVar12 != ':') goto LAB_00119c7d;
    nVar9 = ngx_atoi(puVar18 + sVar23 + 3,(size_t)(puVar15 + (-sVar23 - (long)puVar18) + -3));
    if (0xffffffffffff0000 < nVar9 - 0x10000U) {
      uVar7 = (ushort)nVar9;
      u->port = uVar7;
      (u->sockaddr).sockaddr_in.sin_port = uVar7 << 8 | uVar7 >> 8;
      (u->port_text).len = (size_t)(puVar15 + (-sVar23 - (long)puVar18) + -3);
      (u->port_text).data = puVar18 + sVar23 + 3;
      goto LAB_00119c18;
    }
LAB_00119a29:
    pcVar10 = "invalid port";
    goto LAB_00119c84;
  }
  u->field_0x48 = u->field_0x48 | 8;
  uVar7 = u->default_port;
  u->port = uVar7;
  (u->sockaddr).sockaddr_in.sin_port = uVar7 << 8 | uVar7 >> 8;
LAB_00119c18:
  if (sVar23 != 0) {
    (u->host).len = sVar23 + 2;
    (u->host).data = puVar18;
    addr = (u->sockaddr).sockaddr_in.sin_zero;
    nVar9 = ngx_inet6_addr(puVar18 + 1,sVar23,addr);
    if (nVar9 != 0) {
      pcVar10 = "invalid IPv6 address";
      goto LAB_00119c84;
    }
    if ((((*(int *)addr == 0) && (*(int *)((long)&u->sockaddr + 0xc) == 0)) &&
        (*(int *)((long)&u->sockaddr + 0x10) == 0)) && (*(int *)((long)&u->sockaddr + 0x14) == 0)) {
      u->field_0x48 = u->field_0x48 | 0x10;
    }
    u->family = 10;
    u->naddrs = 1;
    pnVar13 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
    u->addrs = pnVar13;
    if (pnVar13 == (ngx_addr_t *)0x0) {
      return -1;
    }
    psVar14 = (sockaddr *)ngx_pcalloc(pool,0x1c);
    if (psVar14 == (sockaddr *)0x0) {
      return -1;
    }
    uVar3 = *(undefined8 *)&u->sockaddr;
    uVar4 = *(undefined8 *)((long)&u->sockaddr + 8);
    uVar5 = *(undefined8 *)((long)&u->sockaddr + 0x14);
    *(undefined8 *)(psVar14->sa_data + 10) = *(undefined8 *)((long)&u->sockaddr + 0xc);
    *(undefined8 *)(psVar14[1].sa_data + 2) = uVar5;
    psVar14->sa_family = (short)uVar3;
    psVar14->sa_data[0] = (char)((ulong)uVar3 >> 0x10);
    psVar14->sa_data[1] = (char)((ulong)uVar3 >> 0x18);
    psVar14->sa_data[2] = (char)((ulong)uVar3 >> 0x20);
    psVar14->sa_data[3] = (char)((ulong)uVar3 >> 0x28);
    psVar14->sa_data[4] = (char)((ulong)uVar3 >> 0x30);
    psVar14->sa_data[5] = (char)((ulong)uVar3 >> 0x38);
    *(undefined8 *)(psVar14->sa_data + 6) = uVar4;
    pnVar13 = u->addrs;
    pnVar13->sockaddr = psVar14;
    pnVar13->socklen = 0x1c;
    goto LAB_00119d8c;
  }
LAB_00119ddb:
  pcVar10 = "no host";
LAB_00119c84:
  u->err = pcVar10;
  return -1;
}

Assistant:

ngx_int_t
ngx_parse_url(ngx_pool_t *pool, ngx_url_t *u)
{
    u_char  *p;
    size_t   len;

    p = u->url.data;
    len = u->url.len;

    if (len >= 5 && ngx_strncasecmp(p, (u_char *) "unix:", 5) == 0) {
        return ngx_parse_unix_domain_url(pool, u);
    }

    if (len && p[0] == '[') {
        return ngx_parse_inet6_url(pool, u);
    }

    return ngx_parse_inet_url(pool, u);
}